

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

void __thiscall llama_model_loader::load_data_for(llama_model_loader *this,ggml_tensor *cur)

{
  ggml_type gVar1;
  void *pvVar2;
  llama_file *this_00;
  char cVar3;
  char *pcVar4;
  llama_tensor_weight *plVar5;
  const_reference pvVar6;
  void *pvVar7;
  size_t __n;
  const_reference pvVar8;
  size_t len;
  undefined8 uVar9;
  runtime_error *this_01;
  string local_50;
  
  pcVar4 = (char *)ggml_get_name(cur);
  plVar5 = require_weight(this,pcVar4);
  if (this->use_mmap == true) {
    pvVar6 = std::
             vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
             ::at(&this->mappings,(ulong)plVar5->idx);
    pvVar2 = cur->data;
    pvVar7 = llama_mmap::addr((pvVar6->_M_t).
                              super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>
                              .super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl);
    pvVar7 = (void *)((long)pvVar7 + plVar5->offs);
    if (pvVar2 == (void *)0x0) {
      cur->data = pvVar7;
    }
    else {
      __n = ggml_nbytes(cur);
      memcpy(pvVar2,pvVar7,__n);
    }
LAB_001f62ac:
    if (this->check_tensors == true) {
      gVar1 = cur->type;
      pvVar2 = cur->data;
      uVar9 = ggml_nbytes(cur);
      cVar3 = ggml_validate_row_data(gVar1,pvVar2,uVar9);
      if (cVar3 == '\0') {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        uVar9 = ggml_get_name(cur);
        format_abi_cxx11_(&local_50,"tensor \'%s\' has invalid data",uVar9);
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    return;
  }
  if (cur->data == (void *)0x0) {
    pcVar4 = "cur->data != nullptr";
    uVar9 = 0x368;
  }
  else {
    if ((ulong)plVar5->idx <
        (ulong)((long)(this->files).
                      super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->files).
                      super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar8 = std::
               vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
               ::at(&this->files,(ulong)plVar5->idx);
      llama_file::seek((pvVar8->_M_t).
                       super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
                       super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                       super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,plVar5->offs,0);
      this_00 = (pvVar8->_M_t).super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
                _M_t.super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                super__Head_base<0UL,_llama_file_*,_false>._M_head_impl;
      pvVar2 = cur->data;
      len = ggml_nbytes(cur);
      llama_file::read_raw(this_00,pvVar2,len);
      goto LAB_001f62ac;
    }
    pcVar4 = "w.idx < files.size()";
    uVar9 = 0x369;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
             ,uVar9,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

void llama_model_loader::load_data_for(struct ggml_tensor * cur) const {
    const auto & w = require_weight(ggml_get_name(cur));

    if (use_mmap) {
        const auto & mapping = mappings.at(w.idx);
        if (cur->data == nullptr) {
            cur->data = (uint8_t *)mapping->addr() + w.offs;
        } else {
            memcpy(cur->data, (uint8_t *)mapping->addr() + w.offs, ggml_nbytes(cur));
        }
    } else {
        GGML_ASSERT(cur->data != nullptr);
        GGML_ASSERT(w.idx < files.size());
        const auto & file = files.at(w.idx);
        file->seek(w.offs, SEEK_SET);
        file->read_raw(cur->data, ggml_nbytes(cur));
    }

    if (check_tensors && !ggml_validate_row_data(cur->type, cur->data, ggml_nbytes(cur))) {
        throw std::runtime_error(format("tensor '%s' has invalid data", ggml_get_name(cur)));
    }
}